

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptCompoundStatement(HlslGrammar *this,TIntermNode **retStatement)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermAggregate *statements;
  TIntermNode *right;
  TIntermNode *statement;
  TIntermNode *local_30;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    local_30 = (TIntermNode *)0x0;
    statements = (TIntermAggregate *)0x0;
    while (bVar1 = acceptStatement(this,&local_30), bVar1) {
      if (local_30 == (TIntermNode *)0x0) {
        right = (TIntermNode *)0x0;
LAB_003aa8c2:
        statements = TIntermediate::growAggregate
                               (this->intermediate,(TIntermNode *)statements,right);
      }
      else {
        iVar2 = (*local_30->_vptr_TIntermNode[0xd])();
        right = local_30;
        if ((CONCAT44(extraout_var,iVar2) == 0) ||
           (1 < *(int *)(CONCAT44(extraout_var,iVar2) + 0x20) - 0x16dU)) goto LAB_003aa8c2;
        HlslParseContext::wrapupSwitchSubsequence(this->parseContext,statements,local_30);
        statements = (TIntermAggregate *)0x0;
      }
    }
    if (statements != (TIntermAggregate *)0x0) {
      (*(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
        [0x31])(statements,(ulong)(this->intermediate->debugInfo + 1));
    }
    *retStatement = (TIntermNode *)statements;
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptCompoundStatement(TIntermNode*& retStatement)
{
    TIntermAggregate* compoundStatement = nullptr;

    // LEFT_CURLY
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // statement statement ...
    TIntermNode* statement = nullptr;
    while (acceptStatement(statement)) {
        TIntermBranch* branch = statement ? statement->getAsBranchNode() : nullptr;
        if (branch != nullptr && (branch->getFlowOp() == EOpCase ||
                                  branch->getFlowOp() == EOpDefault)) {
            // hook up individual subsequences within a switch statement
            parseContext.wrapupSwitchSubsequence(compoundStatement, statement);
            compoundStatement = nullptr;
        } else {
            // hook it up to the growing compound statement
            compoundStatement = intermediate.growAggregate(compoundStatement, statement);
        }
    }
    if (compoundStatement)
        compoundStatement->setOperator(intermediate.getDebugInfo() ? EOpScope : EOpSequence);

    retStatement = compoundStatement;

    // RIGHT_CURLY
    return acceptTokenClass(EHTokRightBrace);
}